

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBuilderTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LayoutBuilderTests::TrimmingSingleRangeRestoresExtentAndGlyphs
          (LayoutBuilderTests *this)

{
  glyph_runs_container_t *glyph_runs;
  text_lines_container_t *text_lines;
  ptr *font_;
  positioned_glyph *ppVar1;
  real_t rVar2;
  ulong uVar3;
  uint uVar4;
  allocator local_421;
  ref_text_line local_420;
  undefined1 local_3f8 [56];
  undefined1 local_3c0 [56];
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [2];
  undefined1 local_358 [56];
  ref_text_line local_320;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_2f8;
  string local_2d8;
  LocationInfo local_2b8;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_288;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_278;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_268;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_258;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_240;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_230;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_220;
  uint local_20c [5];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_1f8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_188;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_170;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_158;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_140;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_128;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_f8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_c8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_98;
  state s2;
  state s1;
  layout_builder local_68;
  
  glyph_runs = &this->glyph_runs;
  text_lines = &this->text_lines;
  layout_builder::layout_builder(&local_68,&this->glyphs,glyph_runs,text_lines);
  font_ = &this->font2;
  layout_builder::begin_style(&local_68,font_);
  ppVar1 = (local_68._glyphs)->_begin;
  ppVar1[local_68._state.next].index = 0xb;
  ppVar1[local_68._state.next].d.dx = 3.0;
  ppVar1[local_68._state.next].d.dy = 0.0;
  uVar4 = local_68._state.next + 2;
  ppVar1[local_68._state.next + 1].index = 0xc;
  ppVar1[local_68._state.next + 1].d.dx = 5.3;
  ppVar1[local_68._state.next + 1].d.dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.0 + 5.3;
  s1.next = uVar4;
  s1.extent = local_68._state.extent;
  local_68._state.next = local_68._state.next + 3;
  ppVar1[uVar4].index = 0xd;
  ppVar1[uVar4].d.dx = 3.1;
  ppVar1[uVar4].d.dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.1;
  layout_builder::trim_current_line(&local_68,&s1);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_220,&font_->super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_320._offset.dx = 1.54143e-44;
  plural_::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0,
                     (plural_ *)&plural,(uint *)&local_320);
  local_2b8.filename._M_dataplus._M_p._0_4_ = 0xc;
  tests::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_388,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0,
                   (uint *)&local_2b8);
  ref_glyph_run::ref_glyph_run<unsigned_int>
            ((ref_glyph_run *)local_3c0,(shared_ptr<agge::font> *)&local_220,0.0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_388);
  plural_::operator+((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                      *)&local_420,(plural_ *)&plural,(ref_glyph_run *)local_3c0);
  std::__cxx11::string::string
            ((string *)local_358,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,(allocator *)&local_2d8);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_3f8,(string *)local_358,0x12f);
  ut::
  are_equal<std::vector<agge::tests::ref_glyph_run,std::allocator<agge::tests::ref_glyph_run>>,std::vector<agge::glyph_run,std::allocator<agge::glyph_run>>>
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_420,glyph_runs,(LocationInfo *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  std::__cxx11::string::~string((string *)local_358);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_420);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_3c0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_388);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_220._M_refcount);
  local_388._0_4_ = 0.0;
  local_388._4_4_ = 0.0;
  local_388._8_8_ = (pointer)0x0;
  local_378[0]._M_allocated_capacity = (pointer)0x0;
  ref_text_line::ref_text_line
            ((ref_text_line *)local_3c0,0.0,0.0,0.0,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_388);
  plural_::operator+((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>
                      *)&local_420,(plural_ *)&plural,(ref_text_line *)local_3c0);
  std::__cxx11::string::string
            ((string *)local_358,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,(allocator *)&local_320);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_3f8,(string *)local_358,0x130);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_420,text_lines,(LocationInfo *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  std::__cxx11::string::~string((string *)local_358);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_420);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             (local_3c0 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_388);
  rVar2 = local_68._state.extent;
  std::__cxx11::string::string
            ((string *)local_3f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,(allocator *)local_358);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_3c0,(string *)local_3f8,0x131);
  ut::are_approx_equal<float>(8.3,rVar2,0.001,(LocationInfo *)local_3c0);
  std::__cxx11::string::~string((string *)local_3c0);
  std::__cxx11::string::~string((string *)local_3f8);
  layout_builder::break_current_line(&local_68);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_230,&font_->super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_2d8._M_dataplus._M_p._0_4_ = 0xb;
  plural_::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e0,
                     (plural_ *)&plural,(uint *)&local_2d8);
  local_2f8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_2f8.
                         super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xc);
  tests::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_320,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e0,
                   (uint *)&local_2f8);
  ref_glyph_run::ref_glyph_run<unsigned_int>
            ((ref_glyph_run *)local_3c0,(shared_ptr<agge::font> *)&local_230,0.0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_320);
  plural_::operator+(&local_c8,(plural_ *)&plural,(ref_glyph_run *)local_3c0);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1c8,&font_->super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_2b8.filename._M_dataplus._M_p = (pointer)0x0;
  local_2b8.filename._M_string_length = 0;
  local_2b8.filename.field_2._M_allocated_capacity = 0;
  ref_glyph_run::ref_glyph_run<unsigned_int>
            ((ref_glyph_run *)local_3f8,(shared_ptr<agge::font> *)&local_1c8,0.0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b8);
  tests::operator+((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                    *)local_388,&local_c8,(ref_glyph_run *)local_3f8);
  std::__cxx11::string::string
            ((string *)&local_420,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,(allocator *)&local_258);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_358,(string *)&local_420,0x13a);
  ut::
  are_equal<std::vector<agge::tests::ref_glyph_run,std::allocator<agge::tests::ref_glyph_run>>,std::vector<agge::glyph_run,std::allocator<agge::glyph_run>>>
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_388,glyph_runs,(LocationInfo *)local_358);
  std::__cxx11::string::~string((string *)local_358);
  std::__cxx11::string::~string((string *)&local_420);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_388);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_3f8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_c8);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_3c0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_320);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230._M_refcount);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_240,&font_->super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_258.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb;
  plural_::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110,
                     (plural_ *)&plural,(uint *)&local_258);
  local_1e0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xc;
  tests::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110,
                   (uint *)&local_1e0);
  ref_glyph_run::ref_glyph_run<unsigned_int>
            ((ref_glyph_run *)local_3c0,(shared_ptr<agge::font> *)&local_240,0.0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d8);
  plural_::operator+((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                      *)&local_2b8,(plural_ *)&plural,(ref_glyph_run *)local_3c0);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_3f8,0.0,11.0,8.3,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2b8);
  plural_::operator+(&local_f8,(plural_ *)&plural,(ref_text_line *)local_3f8);
  local_2f8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ref_text_line::ref_text_line((ref_text_line *)local_358,0.0,19.3,0.0,&local_2f8);
  tests::operator+((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>
                    *)&local_320,&local_f8,(ref_text_line *)local_358);
  std::__cxx11::string::string
            ((string *)local_388,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,(allocator *)&local_1f8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_420,(string *)local_388,0x13f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_320,text_lines,(LocationInfo *)&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)local_388);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_320);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             (local_358 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2f8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_f8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             (local_3f8 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2b8);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_3c0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_240._M_refcount);
  uVar3 = (ulong)local_68._state.next;
  local_68._state.next = local_68._state.next + 1;
  ppVar1 = (local_68._glyphs)->_begin;
  ppVar1[uVar3].index = 0xe;
  ppVar1 = ppVar1 + uVar3;
  (ppVar1->d).dx = 5.7;
  (ppVar1->d).dy = 0.0;
  local_68._state.extent = local_68._state.extent + 5.7;
  layout_builder::begin_style(&local_68,&this->font1);
  ppVar1 = (local_68._glyphs)->_begin;
  ppVar1[local_68._state.next].index = 0xf;
  ppVar1[local_68._state.next].d.dx = 3.2;
  ppVar1[local_68._state.next].d.dy = 0.0;
  uVar4 = local_68._state.next + 2;
  ppVar1[local_68._state.next + 1].index = 0x10;
  local_68._state.extent = local_68._state.extent + 3.2 + 2.9;
  ppVar1[local_68._state.next + 1].d.dx = 2.9;
  ppVar1[local_68._state.next + 1].d.dy = 0.0;
  s2.next = uVar4;
  s2.extent = local_68._state.extent;
  local_68._state.next = local_68._state.next + 3;
  ppVar1 = (local_68._glyphs)->_begin;
  ppVar1[uVar4].index = 0x11;
  ppVar1 = ppVar1 + uVar4;
  (ppVar1->d).dx = 3.6;
  (ppVar1->d).dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.6;
  layout_builder::trim_current_line(&local_68,&s2);
  rVar2 = local_68._state.extent;
  std::__cxx11::string::string
            ((string *)local_3f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,(allocator *)local_358);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_3c0,(string *)local_3f8,0x14d);
  ut::are_approx_equal<float>(11.8,rVar2,0.001,(LocationInfo *)local_3c0);
  std::__cxx11::string::~string((string *)local_3c0);
  std::__cxx11::string::~string((string *)local_3f8);
  layout_builder::break_current_line(&local_68);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_268,&font_->super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_20c[4] = 0xb;
  plural_::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_158,
                     (plural_ *)&plural,local_20c + 4);
  local_20c[3] = 0xc;
  tests::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_158,local_20c + 3);
  ref_glyph_run::ref_glyph_run<unsigned_int>
            ((ref_glyph_run *)local_3c0,(shared_ptr<agge::font> *)&local_268,0.0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0);
  plural_::operator+(&local_258,(plural_ *)&plural,(ref_glyph_run *)local_3c0);
  ref_text_line::ref_text_line(&local_420,0.0,11.0,8.3,&local_258);
  plural_::operator+(&local_140,(plural_ *)&plural,&local_420);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_278,&font_->super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_20c[2] = 0xe;
  plural_::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_188,
                     (plural_ *)&plural,local_20c + 2);
  ref_glyph_run::ref_glyph_run<unsigned_int>
            ((ref_glyph_run *)local_3f8,(shared_ptr<agge::font> *)&local_278,0.0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_188);
  plural_::operator+(&local_170,(plural_ *)&plural,(ref_glyph_run *)local_3f8);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_288,&(this->font1).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_20c[1] = 0xf;
  plural_::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b8,
                     (plural_ *)&plural,local_20c + 1);
  local_20c[0] = 0x10;
  tests::operator+((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b8,local_20c);
  ref_glyph_run::ref_glyph_run<unsigned_int>
            ((ref_glyph_run *)local_358,(shared_ptr<agge::font> *)&local_288,5.7,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a0);
  tests::operator+(&local_1f8,&local_170,(ref_glyph_run *)local_358);
  ref_text_line::ref_text_line((ref_text_line *)local_388,0.0,30.3,11.8,&local_1f8);
  tests::operator+(&local_128,&local_140,(ref_text_line *)local_388);
  local_98.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ref_text_line::ref_text_line(&local_320,0.0,38.6,0.0,&local_98);
  tests::operator+((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>
                    *)&local_2f8,&local_128,&local_320);
  std::__cxx11::string::string
            ((string *)&local_2d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,&local_421);
  ut::LocationInfo::LocationInfo(&local_2b8,&local_2d8,0x15a);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2f8,text_lines,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2f8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_320._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_98);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_128);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_378);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1f8);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_358);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1a0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288._M_refcount);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_170);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_3f8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_140);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_420._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_258);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_3c0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1e0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
  return;
}

Assistant:

test( TrimmingSingleRangeRestoresExtentAndGlyphs )
			{
				// INIT
				layout_builder m(glyphs, glyph_runs, text_lines);

				m.begin_style(font2);
				m.append_glyph(11, 3.0f);
				m.append_glyph(12, 5.3f);
				layout_builder::state s1 = m.get_state();
				m.append_glyph(13, 3.1f);

				// ACT
				m.trim_current_line(s1);

				// ASSERT
				assert_equal(plural + ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u), glyph_runs);
				assert_equal(plural + ref_text_line(0.0f, 0.0f, 0.0f, vector<ref_glyph_run>()), text_lines);
				assert_approx_equal(8.3f, m.get_state().extent, 0.001);

				// ACT
				m.break_current_line();

				// ASSERT
				assert_equal(plural
					+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u)
					+ ref_glyph_run(font2, 0.0f, 0.0f, vector<glyph_index_t>()),
					glyph_runs);
				assert_equal(plural
					+ ref_text_line(0.0f, 11.0f, 8.3f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u))
					+ ref_text_line(0.0f, 19.3f, 0.0f, vector<ref_glyph_run>()),
					text_lines);

				// INIT
				m.append_glyph(14, 5.7f);
				m.begin_style(font1);
				m.append_glyph(15, 3.2f);
				m.append_glyph(16, 2.9f);
				layout_builder::state s2 = m.get_state();
				m.append_glyph(17, 3.6f);

				// ACT
				m.trim_current_line(s2);

				//ASSERT
				assert_approx_equal(11.8f, m.get_state().extent, 0.001);

				// ACT
				m.break_current_line();

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 11.0f, 8.3f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u))
					+ ref_text_line(0.0f, 30.3f, 11.8f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 14u)
						+ ref_glyph_run(font1, 5.7f, 0.0f, plural + 15u + 16u))
					+ ref_text_line(0.0f, 38.6f, 0.0f, vector<ref_glyph_run>()),
					text_lines);
			}